

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver1M1P<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                     *__return_storage_ptr__,
                    vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                            *plPair,
                    vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                           *lCPair)

{
  pointer ppVar1;
  pointer ppVar2;
  iterator __position;
  undefined1 auVar3 [16];
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  PointerType ptr;
  undefined8 *puVar7;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar8;
  ostream *poVar9;
  long lVar10;
  double *pdVar11;
  pointer pMVar12;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar13;
  iterator iVar14;
  long lVar15;
  byte bVar16;
  Scalar SVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar36;
  undefined1 auVar33 [16];
  double dVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  predTrans;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  lines1;
  Matrix<double,_4,_1,_0,_4,_1> PiU;
  Matrix<double,_4,_4,_0,_4,_4> TV1;
  Matrix<double,_6,_6,_0,_6,_6> TuL1;
  Matrix<double,_4,_4,_0,_4,_4> TV2;
  Matrix<double,_4,_1,_0,_4,_1> NuU;
  Matrix<double,_4,_1,_0,_4,_1> Nu;
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  Matrix<double,_6,_6,_0,_6,_6> TUL2;
  Matrix<double,_6,_6,_0,_6,_6> TuL2;
  Matrix<double,_4,_4,_0,_4,_4> Tu1;
  Matrix<double,_6,_6,_0,_6,_6> TUL1;
  Matrix<double,_4,_4,_0,_4,_4> Tu2;
  Matrix<double,_4,_4,_0,_4,_4> TU1;
  Matrix<double,_4,_4,_0,_4,_4> sol;
  Matrix<double,_4,_4,_0,_4,_4> TU2;
  Matrix<double,_3,_3,_0,_3,_3> V2;
  Matrix<double,_3,_3,_0,_3,_3> V1;
  double local_e08;
  double dStack_e00;
  double dStack_dc0;
  Scalar local_db8;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_db0;
  double local_d98;
  double dStack_d90;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  local_d80;
  double local_d68;
  double dStack_d60;
  double local_d58;
  double dStack_d50;
  undefined1 local_d48 [16];
  double local_d38;
  double dStack_d30;
  double local_d28;
  double dStack_d20;
  double local_d18;
  double dStack_d10;
  double local_d08;
  double dStack_d00;
  double local_cf8;
  double dStack_cf0;
  double local_ce8;
  double dStack_ce0;
  double local_cd8;
  double dStack_cd0;
  Scalar local_cc0;
  Scalar local_cb8;
  Scalar local_cb0;
  Matrix<double,_4,_4,_1,_4,_4> local_ca8;
  double *local_c28;
  Matrix<double,_4,_4,_1,_4,_4> *local_c20;
  double *local_c18;
  ulong local_c10;
  Matrix<double,_4,_4,_1,_4,_4> local_c08;
  Matrix<double,_4,_1,_0,_4,_1> *local_b88;
  Matrix<double,_4,_4,_1,_4,_4> *local_b80;
  Matrix<double,_4,_1,_0,_4,_1> *pMStack_b78;
  double local_b70;
  double dStack_b68;
  undefined8 local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  double local_b48;
  double dStack_b40;
  double local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 local_b20;
  double dStack_b18;
  double local_b10;
  double dStack_b08;
  undefined8 local_b00;
  SrcXprType SStack_af8;
  double local_af0;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_ae8;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  double local_a68;
  double dStack_a60;
  double local_a58;
  double dStack_a50;
  Matrix<double,_4,_1,_0,_4,_1> local_a48;
  Matrix<double,_4,_1,_0,_4,_1> local_a28;
  undefined1 local_a08 [16];
  double dStack_9f8;
  Matrix<double,_3,_3,_0,_3,_3> MStack_9f0;
  double local_9a8;
  double dStack_9a0;
  double local_998;
  double dStack_990;
  double dStack_988;
  double dStack_980;
  double dStack_978;
  double local_970;
  double dStack_968;
  double local_960;
  double local_958;
  double dStack_950;
  double local_948;
  double dStack_940;
  double local_938;
  double dStack_930;
  double local_928;
  double dStack_920;
  double dStack_918;
  double dStack_910;
  double dStack_908;
  double local_900;
  double dStack_8f8;
  double local_8f0;
  Matrix<double,_3,_3,_0,_3,_3> local_8e8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  double local_888;
  double dStack_880;
  double local_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  double dStack_858;
  double local_850;
  double dStack_848;
  undefined8 local_840;
  undefined8 local_838;
  undefined8 uStack_830;
  double local_828;
  double dStack_820;
  double local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 local_800;
  double dStack_7f8;
  double local_7f0;
  double dStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  double local_7c8;
  double dStack_7c0;
  double local_7b8;
  undefined8 uStack_7b0;
  double local_7a8;
  undefined8 uStack_7a0;
  double local_798;
  undefined8 uStack_790;
  double local_788;
  undefined8 uStack_780;
  double local_778;
  double dStack_770;
  double local_768;
  double dStack_760;
  double local_758;
  undefined8 uStack_750;
  double local_748;
  double dStack_740;
  double local_738;
  double dStack_730;
  undefined1 local_728 [16];
  double local_718;
  undefined8 uStack_710;
  double local_708;
  double dStack_700;
  double local_6f8;
  undefined8 uStack_6f0;
  double local_6e8;
  undefined8 uStack_6e0;
  double local_6d8;
  undefined8 uStack_6d0;
  double local_6c8;
  double dStack_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double dStack_690;
  undefined1 local_688 [16];
  double local_678;
  double dStack_670;
  double local_668;
  double dStack_660;
  Matrix<double,_4,_4,_0,_4,_4> *local_658;
  double dStack_650;
  double local_648;
  double dStack_640;
  double local_638;
  double dStack_630;
  double local_628;
  undefined8 uStack_620;
  double local_618;
  undefined8 uStack_610;
  double local_608;
  undefined8 uStack_600;
  double local_5f8;
  double dStack_5f0;
  undefined1 local_5e8 [112];
  double dStack_578;
  double local_570;
  Scalar local_568;
  Scalar local_560;
  undefined1 local_558 [16];
  double dStack_548;
  Matrix<double,_3,_3,_0,_3,_3> MStack_540;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double dStack_4d8;
  double dStack_4d0;
  double dStack_4c8;
  double local_4c0;
  double dStack_4b8;
  double local_4b0;
  double local_4a8;
  double dStack_4a0;
  double local_498;
  double dStack_490;
  double local_488;
  double dStack_480;
  double local_478;
  double dStack_470;
  double dStack_468;
  double local_460;
  double dStack_458;
  double local_450;
  double dStack_448;
  double local_440;
  undefined1 local_438 [112];
  double adStack_3c8 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_3b8;
  Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>
  local_338;
  Matrix<double,_4,_4,_0,_4,_4> local_308;
  Matrix<double,_4,_4,_0,_4,_4> local_288;
  Matrix<double,_3,_1,_0,_3,_1> local_208;
  undefined1 local_1e8 [16];
  double local_1d8;
  Matrix<double,_3,_1,_0,_3,_1> local_1c8;
  Matrix<double,_3,_1,_0,_3,_1> local_1a8;
  Matrix<double,_3,_3,_0,_3,_3> local_190;
  Matrix<double,_4,_1,_0,_4,_1> local_148;
  Matrix<double,_4,_1,_0,_4,_1> local_128;
  Matrix<double,_3,_3,_0,_3,_3> local_100;
  pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  local_b8;
  
  bVar16 = 0;
  ppVar1 = (lCPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((lCPair->
       super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish == ppVar1) &&
     ((ulong)((long)(plPair->
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(plPair->
                   super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41)) {
    poVar9 = std::operator<<((ostream *)&std::cerr,
                             "Solver 1M1P requires at least 1 line and 1 plane correspondence!");
    std::endl<char,std::char_traits<char>>(poVar9);
    exit(-1);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    (__return_storage_ptr__->
    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  ppVar2 = (plPair->
           super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       *(double *)
        &(ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 8);
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 0x10);
  local_a28.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(ppVar2->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 0x18);
  local_a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       (ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  local_a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       *(double *)
        ((long)&(ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 8);
  local_a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       *(double *)
        ((long)&(ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 0x10);
  local_a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       *(double *)
        ((long)&(ppVar2->second).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage + 0x18);
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[0] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[0];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[1] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[1];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[2] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[2];
  local_b8.first.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3] = (ppVar1->first).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array[3];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[0];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[1];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[2];
  local_b8.second.first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->second).first.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
       .m_data.array[3];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[0] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[1] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[1];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[2] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[2];
  local_b8.second.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
  m_data.array[3] =
       (ppVar1->second).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[3];
  getPluckerCoord<double>(&local_d80,&local_b8);
  local_558._8_8_ = 1.48219693752374e-323;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = 1.97626258336499e-323;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = (double)local_d80.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = 1.48219693752374e-323;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = (double)local_d80.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = 0.0;
  dStack_4f0 = 2.96439387504748e-323;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = (double)local_d80.
                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_a08._8_8_ = &local_a28;
  local_558._0_8_ = &local_a28;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = (double)&local_a28;
  SVar17 = Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)local_a08,(scalar_sum_op<double,_double> *)&local_c08,
                      (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)local_558);
  if (ABS(SVar17) < 1e-06) {
LAB_001ae146:
    if (local_d80.
        super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d80.
                      super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d80.
                            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d80.
                            super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_a28.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [0];
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       local_a28.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1];
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       local_a28.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [2];
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       local_a28.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [3];
  local_148.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       local_a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [0];
  local_148.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       local_a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [1];
  local_148.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       local_a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [2];
  local_148.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       local_a48.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
       [3];
  getPredefinedTransformations1Plane3Line<double>(&local_db0,&local_128,&local_148,false);
  lVar15 = 0x10;
  pMVar12 = local_db0.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
  pMVar13 = &local_288;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar12 = (pointer)((long)pMVar12 + ((ulong)bVar16 * -2 + 1) * 8);
    pMVar13 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  local_db0.
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_db0.
       super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -2;
  pMVar12 = local_db0.
            super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pMVar13 = &local_3b8;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar12->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar12 = (pointer)((long)pMVar12 + ((ulong)bVar16 * -2 + 1) * 8);
    pMVar13 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar13 + ((ulong)bVar16 * -2 + 1) * 8);
  }
  puVar7 = (undefined8 *)(local_558 + 0x10);
  local_558._0_8_ = (Matrix<double,_4,_1,_0,_4,_1> *)0x3ff0000000000000;
  local_558._8_8_ = 0.0;
  dStack_548 = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = 1.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = 0.0;
  MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = 0.0;
  local_4f8 = 0.0;
  dStack_4f0 = 0.0;
  local_4e8 = 1.0;
  dStack_4e0 = 0.0;
  dStack_4d8 = 0.0;
  dStack_4d0 = 0.0;
  dStack_4c8 = 0.0;
  local_4c0 = 0.0;
  dStack_4b8 = 0.0;
  local_4b0 = 1.0;
  local_4a8 = 0.0;
  dStack_4a0 = 0.0;
  local_498 = 0.0;
  dStack_490 = 0.0;
  local_488 = 0.0;
  dStack_480 = 0.0;
  local_478 = 1.0;
  local_450 = 0.0;
  dStack_448 = 0.0;
  local_460 = 0.0;
  dStack_458 = 0.0;
  dStack_470 = 0.0;
  dStack_468 = 0.0;
  local_440 = 1.0;
  local_a08._0_8_ = 1.0;
  local_a08._8_8_ = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
  dStack_9f8 = 0.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = 0.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = 0.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = 0.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = 1.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = 0.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
       = 0.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = 0.0;
  MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = 0.0;
  local_9a8 = 0.0;
  dStack_9a0 = 0.0;
  local_998 = 1.0;
  dStack_990 = 0.0;
  dStack_988 = 0.0;
  dStack_980 = 0.0;
  dStack_978 = 0.0;
  local_970 = 0.0;
  dStack_968 = 0.0;
  local_960 = 1.0;
  local_958 = 0.0;
  dStack_950 = 0.0;
  local_948 = 0.0;
  dStack_940 = 0.0;
  local_938 = 0.0;
  dStack_930 = 0.0;
  local_928 = 1.0;
  local_900 = 0.0;
  dStack_8f8 = 0.0;
  dStack_910 = 0.0;
  dStack_908 = 0.0;
  dStack_920 = 0.0;
  dStack_918 = 0.0;
  local_8f0 = 1.0;
  do {
    uVar5 = *(undefined8 *)((long)adStack_3c8 + lVar15 + 8);
    puVar7[-2] = *(undefined8 *)((long)adStack_3c8 + lVar15);
    puVar7[-1] = uVar5;
    *puVar7 = *(undefined8 *)
               ((long)local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array + lVar15);
    lVar15 = lVar15 + 0x20;
    puVar7 = puVar7 + 6;
  } while (lVar15 != 0x70);
  lVar10 = 8;
  pdVar11 = &local_4a8;
  do {
    pdVar11[-1] = *(double *)((long)adStack_3c8 + lVar10 + 8);
    dVar38 = *(double *)
              ((long)local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array + lVar10 + 8);
    *pdVar11 = *(double *)
                ((long)local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar10);
    pdVar11[1] = dVar38;
    pdVar11 = pdVar11 + 6;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x68);
  local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_8e8,&local_1a8);
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (double)(local_558 + 0x18);
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       1.97626258336499e-323;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] =
       1.48219693752374e-323;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       (double)local_558;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&local_8e8;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] =
       (double)&local_3b8;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[5] =
       (double)&local_3b8;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_ca8,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&local_c08,(assign_op<double,_double> *)local_5e8,(type)0x0);
  lVar10 = 0x10;
  puVar7 = (undefined8 *)(local_a08 + 0x10);
  do {
    uVar5 = *(undefined8 *)
             ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                    .m_data.array + lVar10 + 0x78);
    puVar7[-2] = *(undefined8 *)
                  ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                         m_storage.m_data.array + lVar10 + 0x70);
    puVar7[-1] = uVar5;
    *puVar7 = *(undefined8 *)
               ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array + lVar10);
    lVar10 = lVar10 + 0x20;
    puVar7 = puVar7 + 6;
  } while (lVar10 != 0x70);
  lVar10 = 8;
  pdVar11 = &local_958;
  do {
    pdVar11[-1] = *(double *)
                   ((long)local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + lVar10 + 0x78);
    dVar38 = *(double *)
              ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                     m_storage.m_data.array + lVar10 + 8);
    *pdVar11 = *(double *)
                ((long)local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array + lVar10);
    pdVar11[1] = dVar38;
    pdVar11 = pdVar11 + 6;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x68);
  local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xc];
  local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xd];
  local_1c8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_288.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
       [0xe];
  getSkew<double>(&local_8e8,&local_1c8);
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (double)(local_a08 + 0x18);
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       0.0;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7] =
       0.0;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       1.48219693752374e-323;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[8] =
       1.97626258336499e-323;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] =
       1.48219693752374e-323;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] =
       1.48219693752374e-323;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] =
       (double)local_a08;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[4] =
       1.48219693752374e-323;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[5] =
       0.0;
  local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6] =
       2.96439387504748e-323;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] =
       (double)&local_8e8;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] =
       (double)&local_288;
  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[5] =
       (double)&local_288;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,6,6,0,6,6>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
            ((Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,__1,__1,_false> *)&local_ca8,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
              *)&local_c08,(assign_op<double,_double> *)local_5e8,(type)0x0);
  dVar38 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  dVar47 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  dVar31 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  dVar37 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  dVar18 = (double)local_558._0_8_ * dVar38;
  dVar26 = (double)local_558._8_8_ * dVar38;
  dVar19 = MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] * dVar47;
  dVar27 = MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] * dVar47;
  dVar20 = local_4f8 * dVar31;
  dVar28 = dStack_4f0 * dVar31;
  dVar21 = dStack_4c8 * dVar37;
  dVar29 = local_4c0 * dVar37;
  dVar32 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4];
  dVar30 = local_498 * dVar32;
  dVar36 = dStack_490 * dVar32;
  dVar39 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5];
  dVar40 = dStack_468 * dVar39;
  dVar42 = local_460 * dVar39;
  dVar41 = local_450 * dVar39 +
           dStack_480 * dVar32 +
           dVar37 * local_4b0 +
           dVar31 * dStack_4e0 +
           dVar47 * MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[6] +
           dVar38 * MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[0];
  local_d48._8_4_ = SUB84(dVar41,0);
  local_d48._0_8_ =
       dStack_458 * dVar39 +
       local_488 * dVar32 +
       dVar37 * dStack_4b8 +
       dVar31 * local_4e8 +
       dVar47 * MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[5] + dVar38 * dStack_548;
  local_d48._12_4_ = (int)((ulong)dVar41 >> 0x20);
  dVar38 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0];
  dVar47 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1];
  dVar31 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2];
  dVar37 = ((local_d80.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3];
  local_d38 = dVar39 * dStack_448 +
              dVar32 * local_478 +
              dVar37 * local_4a8 +
              dVar31 * dStack_4d8 +
              dVar47 * MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[7] +
              dVar38 * MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[1];
  dStack_d30 = dVar39 * local_440 +
               dVar32 * dStack_470 +
               dVar37 * dStack_4a0 +
               dVar31 * dStack_4d0 +
               dVar47 * MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[8] +
               dVar38 * MStack_540.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[2];
  dVar38 = local_d80.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  dVar47 = local_d80.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  dVar31 = local_d80.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  dVar37 = local_d80.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3];
  local_d98 = (double)local_a08._0_8_ * dVar38;
  dStack_d90 = (double)local_a08._8_8_ * dVar38;
  dVar32 = local_d80.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4];
  dVar39 = local_d80.
           super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5];
  local_d68 = dStack_908 * dVar39 +
              local_938 * dVar32 +
              dStack_968 * dVar37 +
              local_998 * dVar31 +
              MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[5] * dVar47 + dStack_9f8 * dVar38;
  dStack_d60 = local_900 * dVar39 +
               dStack_930 * dVar32 +
               local_960 * dVar37 +
               dStack_990 * dVar31 +
               MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6] * dVar47 +
               MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar38;
  dVar41 = MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] * dVar47;
  dVar43 = MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] * dVar47;
  local_cf8 = local_9a8 * dVar31;
  dStack_cf0 = dStack_9a0 * dVar31;
  local_d08 = dStack_978 * dVar37;
  dStack_d00 = local_970 * dVar37;
  local_d18 = local_948 * dVar32;
  dStack_d10 = dStack_940 * dVar32;
  local_d28 = dStack_918 * dVar39;
  dStack_d20 = dStack_910 * dVar39;
  local_d58 = dVar39 * dStack_8f8 +
              dVar32 * local_928 +
              dVar37 * local_958 +
              dVar31 * dStack_988 +
              dVar47 * MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[7] +
              dVar38 * MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[1];
  dStack_d50 = dVar39 * local_8f0 +
               dVar32 * dStack_920 +
               dVar37 * dStack_950 +
               dVar31 * dStack_980 +
               dVar47 * MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[8] +
               dVar38 * MStack_9f0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                        m_storage.m_data.array[2];
  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_3b8;
  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_a28;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run(&local_c08,(SrcXprType *)&local_8e8,(assign_op<double,_double> *)&local_ca8);
  local_b88 = (Matrix<double,_4,_1,_0,_4,_1> *)
              local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1];
  pMStack_b78 = (Matrix<double,_4,_1,_0,_4,_1> *)
                local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
  local_b70 = 1.97626258336499e-323;
  local_b80 = &local_c08;
  if (((ulong)local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1] & 0xf) == 0) {
    dVar38 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1])->m_storage).m_data.array[2];
    dVar47 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
              local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[1])->m_storage).m_data.array[3];
    local_ce8 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[3] * dVar47 +
                local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[1] *
                (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1])->m_storage).m_data.array[1] +
                local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[2] * dVar38 +
                local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[0] *
                (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1])->m_storage).m_data.array[0];
    dStack_ce0 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[7] * dVar47 +
                 local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[5] *
                 (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1])->m_storage).m_data.array[1] +
                 local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[6] * dVar38 +
                 local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[4] *
                 (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1])->m_storage).m_data.array[0];
    local_cd8 = dVar47 * local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[0xb] +
                local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[9] *
                (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1])->m_storage).m_data.array[1] +
                dVar38 * local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array[10] +
                local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                m_data.array[8] *
                (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1])->m_storage).m_data.array[0];
    dStack_cd0 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0xf] *
                 (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1])->m_storage).m_data.array[3] +
                 local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0xd] *
                 (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1])->m_storage).m_data.array[1] +
                 local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0xe] *
                 (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1])->m_storage).m_data.array[2] +
                 local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                 m_data.array[0xc] *
                 (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1])->m_storage).m_data.array[0];
    local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = (double)&local_a48;
    local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = (double)&local_288;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_c08,(SrcXprType *)&local_8e8,(assign_op<double,_double> *)&local_ca8);
    local_b88 = (Matrix<double,_4,_1,_0,_4,_1> *)
                local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
    pMStack_b78 = (Matrix<double,_4,_1,_0,_4,_1> *)
                  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[1];
    local_b70 = 1.97626258336499e-323;
    local_b80 = &local_c08;
    if (((ulong)local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] & 0xf) == 0) {
      dVar40 = dVar18 + dVar19 + dVar20 + dVar21 + dVar30 + dVar40;
      dVar42 = dVar26 + dVar27 + dVar28 + dVar29 + dVar36 + dVar42;
      local_d98 = local_d98 + dVar41 + local_cf8 + local_d08 + local_d18 + local_d28;
      dStack_d90 = dStack_d90 + dVar43 + dStack_cf0 + dStack_d00 + dStack_d10 + dStack_d20;
      dVar38 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1])->m_storage).m_data.array[2];
      dVar47 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1])->m_storage).m_data.array[3];
      local_a68 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[3] * dVar47 +
                  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[1] *
                  (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                   local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1])->m_storage).m_data.array[1] +
                  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[2] * dVar38 +
                  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[0] *
                  (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                   local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1])->m_storage).m_data.array[0];
      dStack_a60 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[7] * dVar47 +
                   local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[5] *
                   (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                    local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1])->m_storage).m_data.array[1] +
                   local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[6] * dVar38 +
                   local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[4] *
                   (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                    local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1])->m_storage).m_data.array[0];
      local_a58 = dVar47 * local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[0xb] +
                  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[9] *
                  (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                   local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1])->m_storage).m_data.array[1] +
                  dVar38 * local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                           m_storage.m_data.array[10] +
                  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[8] *
                  (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                   local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1])->m_storage).m_data.array[0];
      dStack_a50 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xf] *
                   (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                    local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1])->m_storage).m_data.array[3] +
                   local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xd] *
                   (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                    local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1])->m_storage).m_data.array[1] +
                   local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xe] *
                   (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                    local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1])->m_storage).m_data.array[2] +
                   local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xc] *
                   (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                    local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[1])->m_storage).m_data.array[0];
      auVar44._0_8_ = dStack_ce0 * dVar42 + local_ce8 * dVar40 + (double)local_d48._0_8_ * local_cd8
      ;
      auVar33._0_8_ = (dStack_ce0 * dStack_d30 - local_d38 * local_cd8) - dStack_cd0 * dVar40;
      auVar33._8_8_ =
           (local_cd8 * (double)local_d48._8_8_ - dStack_d30 * local_ce8) - dStack_cd0 * dVar42;
      dStack_578 = ((local_ce8 * local_d38 - dStack_ce0 * (double)local_d48._8_8_) -
                   (double)local_d48._0_8_ * dStack_cd0) / auVar44._0_8_;
      auVar44._8_8_ = auVar44._0_8_;
      local_5e8._96_16_ = divpd(auVar33,auVar44);
      dVar38 = local_a58 * local_d68 + dStack_a60 * dStack_d90 + local_a68 * local_d98;
      auVar45._0_8_ = (dStack_a60 * dStack_d50 - local_d58 * local_a58) - dStack_a50 * local_d98;
      auVar45._8_8_ = (local_a58 * dStack_d60 - dStack_d50 * local_a68) - dStack_a50 * dStack_d90;
      dVar47 = ((local_a68 * local_d58 - dStack_a60 * dStack_d60) - dStack_a50 * local_d68) / dVar38
      ;
      auVar46._8_4_ = SUB84(dVar38,0);
      auVar46._0_8_ = dVar38;
      auVar46._12_4_ = (int)((ulong)dVar38 >> 0x20);
      auVar46 = divpd(auVar45,auVar46);
      local_5e8._0_8_ = 1.0;
      local_5e8._8_8_ = 0.0;
      local_5e8._16_8_ = 0.0;
      local_5e8._24_8_ = 0.0;
      local_5e8._32_8_ = 0.0;
      local_5e8._40_8_ = 1.0;
      local_5e8._48_8_ = 0.0;
      local_5e8._56_8_ = 0.0;
      local_5e8._64_8_ = 0.0;
      local_5e8._72_8_ = 0.0;
      local_5e8._80_8_ = 1.0;
      local_5e8._88_8_ = 0.0;
      local_438._0_8_ = 1.0;
      local_438._8_8_ = 0.0;
      local_438._16_8_ = 0.0;
      local_438._24_8_ = 0.0;
      local_438._32_8_ = 0.0;
      local_438._40_8_ = 1.0;
      local_438._48_8_ = 0.0;
      local_438._56_8_ = 0.0;
      local_438._64_8_ = 0.0;
      local_438._72_8_ = 0.0;
      local_438._80_8_ = 1.0;
      local_438._88_8_ = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0] = 1.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [1] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [2] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [5] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [6] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [7] = 1.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [8] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [9] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [10] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0xc] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0xd] = 0.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0xe] = 1.0;
      local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0xf] = 0.0;
      local_b88 = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
      local_b80 = (Matrix<double,_4,_4,_1,_4,_4> *)0x0;
      pMStack_b78 = (Matrix<double,_4,_1,_0,_4,_1> *)0x0;
      local_b70 = 0.0;
      dStack_b68 = 0.0;
      local_b60 = 0x3ff0000000000000;
      local_b58 = 0;
      uStack_b50 = 0;
      local_b48 = 0.0;
      dStack_b40 = 0.0;
      local_b38 = 0.0;
      uStack_b30 = 0;
      local_b28 = 0x3ff0000000000000;
      local_b00 = 0;
      SStack_af8.m_xpr.m_matrix = (XprTypeNested)(non_const_type)0x0;
      local_b10 = 0.0;
      dStack_b08 = 0.0;
      local_b20 = 0;
      dStack_b18 = 0.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 1.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = 0.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = 0.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = 0.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = 0.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = 1.0;
      local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = 0.0;
      uStack_8a0 = 0;
      local_898 = 0;
      uStack_890 = 0;
      local_888 = 0.0;
      dStack_880 = 0.0;
      local_878 = 1.0;
      uStack_870 = 0;
      uStack_868 = 0;
      local_860 = 0;
      dStack_858 = 0.0;
      local_850 = 0.0;
      dStack_848 = 0.0;
      local_840 = 0x3ff0000000000000;
      local_838 = 0;
      uStack_830 = 0;
      local_828 = 0.0;
      dStack_820 = 0.0;
      local_818 = 0.0;
      uStack_810 = 0;
      local_808 = 0x3ff0000000000000;
      local_7e0 = 0;
      uStack_7d8 = 0;
      local_7f0 = 0.0;
      dStack_7e8 = 0.0;
      local_800 = 0;
      dStack_7f8 = 0.0;
      local_570 = 1.0;
      adStack_3c8[1] = 1.0;
      local_af0 = 1.0;
      local_7d0 = 0x3ff0000000000000;
      local_438._96_16_ = auVar46;
      adStack_3c8[0] = dVar47;
      local_1e8 = local_5e8._96_16_;
      local_1d8 = dStack_578;
      getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&local_ca8,
                      (Matrix<double,_3,_1,_0,_3,_1> *)local_1e8);
      lVar10 = 0x10;
      do {
        *(ulong *)((long)&local_c10 + lVar10 * 2) =
             *(ulong *)((long)&local_cb8 + lVar10) ^ 0x8000000000000000;
        uVar4 = *(ulong *)((long)local_ca8.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                                 m_storage.m_data.array + lVar10);
        *(ulong *)((long)local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array + lVar10 * 2) =
             *(ulong *)((long)local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar10 + -8) ^ 0x8000000000000000;
        *(ulong *)((long)local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                         m_storage.m_data.array + lVar10 * 2 + 8) = uVar4 ^ 0x8000000000000000;
        lVar10 = lVar10 + 0x18;
      } while (lVar10 != 0x58);
      local_e08 = auVar46._0_8_;
      dStack_e00 = auVar46._8_8_;
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_e08;
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = dStack_e00;
      local_208.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = dVar47;
      getSkew<double>((Matrix<double,_3,_3,_0,_3,_3> *)&local_ca8,&local_208);
      dVar47 = dStack_d30;
      dVar38 = local_d38;
      lVar10 = 0x10;
      do {
        *(ulong *)((long)&local_8f0 + lVar10 * 2) =
             *(ulong *)((long)&local_cb8 + lVar10) ^ 0x8000000000000000;
        uVar4 = *(ulong *)((long)local_ca8.
                                 super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                                 m_storage.m_data.array + lVar10);
        *(ulong *)((long)local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar10 * 2) =
             *(ulong *)((long)local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                              .m_storage.m_data.array + lVar10 + -8) ^ 0x8000000000000000;
        *(ulong *)((long)local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array + lVar10 * 2 + 8) = uVar4 ^ 0x8000000000000000;
        lVar10 = lVar10 + 0x18;
      } while (lVar10 != 0x58);
      dVar31 = dVar40 * local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                        m_storage.m_data.array[0];
      dVar37 = dVar40 * local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                        m_storage.m_data.array[1];
      local_cf8 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[6] * dVar42;
      dStack_cf0 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[7] * dVar42;
      uVar5 = local_d48._0_8_;
      uVar6 = local_d48._8_8_;
      local_d08 = (double)local_d48._0_8_ *
                  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[0xc];
      dStack_d00 = (double)local_d48._0_8_ *
                   local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xd];
      local_d18 = (double)local_d48._8_8_ * (double)pMStack_b78;
      dStack_d10 = (double)local_d48._8_8_ * local_b70;
      local_d28 = local_d38 * local_b48;
      dStack_d20 = local_d38 * dStack_b40;
      local_5f8 = dStack_d30 * dStack_b18;
      dStack_5f0 = dStack_d30 * local_b10;
      local_6c8 = local_d98 *
                  local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
      dStack_6c0 = local_d98 *
                   local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1];
      local_718 = local_d68;
      uStack_710 = 0;
      local_738 = local_d68 * local_888;
      dStack_730 = local_d68 * dStack_880;
      local_708 = dStack_d90;
      dStack_700 = dStack_d90;
      local_728._8_4_ =
           SUB84(local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[7] * dStack_d90,0);
      local_728._0_8_ =
           local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] * dStack_d90;
      local_728._12_4_ =
           (int)((ulong)(local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                         m_storage.m_data.array[7] * dStack_d90) >> 0x20);
      local_6f8 = dStack_d60;
      uStack_6f0 = 0;
      local_748 = dStack_d60 * dStack_858;
      dStack_740 = dStack_d60 * local_850;
      local_6e8 = local_d58;
      uStack_6e0 = 0;
      local_768 = local_d58 * local_828;
      dStack_760 = local_d58 * dStack_820;
      local_6d8 = dStack_d50;
      uStack_6d0 = 0;
      local_778 = dStack_d50 * dStack_7f8;
      dStack_770 = dStack_d50 * local_7f0;
      local_ae8.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)local_5e8;
      local_ae8.m_row = (Index)&local_ce8;
      local_658 = (Matrix<double,_4,_4,_0,_4,_4> *)
                  local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[2];
      dStack_650 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[3];
      local_648 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[8];
      dStack_640 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[9];
      local_638 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                  m_data.array[0xe];
      dStack_630 = local_c08.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0xf];
      local_628 = dStack_b68;
      uStack_620 = local_b60;
      local_618 = local_b38;
      uStack_610 = uStack_b30;
      local_608 = dStack_b08;
      uStack_600 = local_b00;
      local_7c8 = local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[2];
      dStack_7c0 = local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[3];
      local_7b8 = local_8e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[8];
      uStack_7b0 = uStack_8a0;
      local_7a8 = local_878;
      uStack_7a0 = uStack_870;
      local_798 = dStack_848;
      uStack_790 = local_840;
      local_788 = local_818;
      uStack_780 = uStack_810;
      local_758 = dStack_7e8;
      uStack_750 = local_7e0;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_ca8,(SrcXprType *)&local_ae8,(assign_op<double,_double> *)&local_308);
      local_c28 = (double *)local_ae8.m_row;
      local_c18 = (double *)local_ae8.m_row;
      local_c10 = 4;
      local_c20 = &local_ca8;
      if ((local_ae8.m_row & 0xfU) == 0) {
        local_678 = *(double *)local_ae8.m_row;
        dStack_670 = *(double *)(local_ae8.m_row + 8);
        dVar32 = *(double *)(local_ae8.m_row + 0x10);
        dVar39 = *(double *)(local_ae8.m_row + 0x18);
        local_668 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[0] * local_678;
        dStack_660 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[1] * dStack_670;
        local_6a8 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[2] * dVar32;
        dStack_6a0 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[3] * dVar39;
        local_698 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[4] * local_678;
        dStack_690 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[5] * dStack_670;
        local_678 = local_678 *
                    local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[8];
        dStack_670 = dStack_670 *
                     local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[9];
        local_6b8 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage
                    .m_data.array[6] * dVar32;
        dStack_6b0 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[7] * dVar39;
        local_688._8_4_ =
             SUB84(dVar39 * local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[0xb],0);
        local_688._0_8_ =
             dVar32 * local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                      m_storage.m_data.array[10];
        local_688._12_4_ =
             (int)((ulong)(dVar39 * local_ca8.
                                    super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                                    m_storage.m_data.array[0xb]) >> 0x20);
        local_ae8.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)local_438;
        local_ae8.m_row = (Index)&local_a68;
        Eigen::internal::
        Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run(&local_ca8,(SrcXprType *)&local_ae8,(assign_op<double,_double> *)&local_308);
        local_c28 = (double *)local_ae8.m_row;
        local_c18 = (double *)local_ae8.m_row;
        local_c10 = 4;
        local_c20 = &local_ca8;
        if ((local_ae8.m_row & 0xfU) == 0) {
          dVar32 = dVar31 + local_cf8 + local_d08 + local_d18 + local_d28 + local_5f8;
          dVar37 = dVar37 + dStack_cf0 + dStack_d00 + dStack_d10 + dStack_d20 + dStack_5f0;
          dVar41 = local_668 + local_6a8 + dStack_660 + dStack_6a0;
          dVar18 = local_698 + local_6b8 + dStack_690 + dStack_6b0;
          dVar31 = dStack_670 + (double)local_688._8_8_ + local_678 + (double)local_688._0_8_;
          dVar39 = dVar47 * local_608 +
                   dVar38 * local_618 +
                   (double)uVar6 * local_628 +
                   (double)uVar5 * local_638 + dVar42 * local_648 + dVar40 * (double)local_658;
          dVar38 = dVar31 * dVar39 + dVar37 * dVar18 + dVar32 * dVar41;
          auVar34._0_8_ = dVar32 - dVar38 * dVar41;
          auVar34._8_8_ = dVar37 - dVar38 * dVar18;
          dVar39 = dVar39 - dVar31 * dVar38;
          dVar47 = *(double *)local_ae8.m_row;
          dVar31 = *(double *)(local_ae8.m_row + 8);
          dVar32 = dVar39 * dVar39 + auVar34._8_8_ * auVar34._8_8_ + auVar34._0_8_ * auVar34._0_8_;
          dVar38 = *(double *)(local_ae8.m_row + 0x10);
          dVar37 = *(double *)(local_ae8.m_row + 0x18);
          if (0.0 < dVar32) {
            auVar22._8_8_ = 0;
            auVar22._0_8_ = dVar32;
            auVar46 = sqrtpd(auVar22,auVar22);
            auVar23._0_8_ = auVar46._0_8_;
            auVar23._8_8_ = auVar23._0_8_;
            auVar34 = divpd(auVar34,auVar23);
          }
          dVar32 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[0] * dVar47;
          dVar19 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[1] * dVar31;
          dVar39 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[2] * dVar38;
          dVar20 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[3] * dVar37;
          dVar41 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[4] * dVar47;
          dVar21 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[5] * dVar31;
          dVar18 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[6] * dVar38;
          dVar26 = local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
                   m_data.array[7] * dVar37;
          dVar47 = dVar47 * local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[8];
          dVar31 = dVar31 * local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[9];
          dVar38 = dVar38 * local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                            m_storage.m_data.array[10];
          auVar3._8_4_ = SUB84(dVar37 * local_ca8.
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>
                                        .m_storage.m_data.array[0xb],0);
          auVar3._0_8_ = dVar38;
          auVar3._12_4_ =
               (int)((ulong)(dVar37 * local_ca8.
                                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                                      m_storage.m_data.array[0xb]) >> 0x20);
          dVar37 = atan2(auVar34._8_8_,auVar34._0_8_);
          local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = cos(dVar37);
          local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0] = (double)&local_100;
          local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[1] = 0.0;
          local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[2] = 4.94065645841247e-324;
          local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[3] = 4.94065645841247e-324;
          local_ae8.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)sin(dVar37);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                             ((CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_ca8,
                              (Scalar *)&local_ae8);
          local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
          array[0] = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar8,(Scalar *)&local_308);
          local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = sin(dVar37);
          local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = -local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[0];
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar8,(Scalar *)&local_190);
          local_338.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)cos(dVar37);
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar8,(Scalar *)&local_338);
          local_db8 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar8,&local_db8);
          local_cb0 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar8,&local_cb0);
          local_cb8 = 0.0;
          pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                             (pCVar8,&local_cb8);
          local_cc0 = 1.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                    (pCVar8,&local_cc0);
          if (((long)local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[3] +
               (long)local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[1] == 3) &&
             (local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.
              m_data.array[2] == 1.48219693752374e-323)) {
            dVar37 = local_6c8 + (double)local_728._0_8_ + local_738 + local_748 + local_768 +
                     local_778;
            dVar27 = dStack_6c0 + (double)local_728._8_8_ + dStack_730 + dStack_740 + dStack_760 +
                     dStack_770;
            dStack_dc0 = auVar3._8_8_;
            dVar39 = dVar32 + dVar39 + dVar19 + dVar20;
            dVar41 = dVar41 + dVar18 + dVar21 + dVar26;
            dVar32 = local_6d8 * local_758 +
                     local_6e8 * local_788 +
                     local_6f8 * local_798 +
                     local_718 * local_7a8 + local_708 * local_7b8 + local_d98 * local_7c8;
            dVar38 = dVar31 + dStack_dc0 + dVar47 + dVar38;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0] = 1.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[1] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[2] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[3] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[4] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[5] = 1.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[6] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[7] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[8] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[9] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[10] = 1.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0xb] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0xc] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0xd] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0xe] = 0.0;
            local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
            array[0xf] = 1.0;
            lVar10 = 0x10;
            pdVar11 = local_100.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array + 2;
            do {
              dVar47 = pdVar11[-1];
              *(double *)((long)&local_cb8 + lVar10) =
                   ((plain_array<double,_9,_0,_0> *)(pdVar11 + -2))->array[0];
              *(double *)
               ((long)local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                      m_storage.m_data.array + lVar10 + -8) = dVar47;
              *(double *)
               ((long)local_ca8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                      m_storage.m_data.array + lVar10) = *pdVar11;
              pdVar11 = pdVar11 + 3;
              lVar10 = lVar10 + 0x20;
            } while (lVar10 != 0x70);
            dVar47 = dVar32 * dVar38 + dVar27 * dVar41 + dVar37 * dVar39;
            auVar35._0_8_ = dVar37 - dVar47 * dVar39;
            auVar35._8_8_ = dVar27 - dVar47 * dVar41;
            dVar32 = dVar32 - dVar38 * dVar47;
            dVar38 = dVar32 * dVar32 + auVar35._8_8_ * auVar35._8_8_ + auVar35._0_8_ * auVar35._0_8_
            ;
            if (0.0 < dVar38) {
              auVar24._8_8_ = 0;
              auVar24._0_8_ = dVar38;
              auVar46 = sqrtpd(auVar24,auVar24);
              auVar25._0_8_ = auVar46._0_8_;
              auVar25._8_8_ = auVar25._0_8_;
              auVar35 = divpd(auVar35,auVar25);
            }
            dVar38 = atan2(auVar35._8_8_,auVar35._0_8_);
            local_190.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] = cos(dVar38);
            local_ae8.m_row = 0;
            local_ae8.m_col = 1;
            local_ae8.m_currentBlockRows = 1;
            local_ae8.m_xpr = &local_190;
            local_308.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0] = sin(dVar38);
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (&local_ae8,(Scalar *)&local_308);
            local_338.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs.m_xpr = (XprTypeNested)0x0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar8,(Scalar *)&local_338);
            local_db8 = sin(dVar38);
            local_db8 = -local_db8;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar8,&local_db8);
            local_cb0 = cos(dVar38);
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar8,&local_cb0);
            local_cb8 = 0.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar8,&local_cb8);
            local_cc0 = 0.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar8,&local_cc0);
            local_560 = 0.0;
            pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                               (pCVar8,&local_560);
            local_568 = 1.0;
            Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                      (pCVar8,&local_568);
            if ((local_ae8.m_currentBlockRows + local_ae8.m_row == 3) && (local_ae8.m_col == 3)) {
              local_ae8.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)0x3ff0000000000000;
              local_ae8.m_row = 0;
              local_ae8.m_col = 0;
              local_ae8.m_currentBlockRows = 0;
              uStack_ac8 = 0;
              local_ac0 = 0x3ff0000000000000;
              local_ab8 = 0;
              uStack_ab0 = 0;
              local_aa8 = 0;
              uStack_aa0 = 0;
              local_a98 = 0x3ff0000000000000;
              local_a90 = 0;
              uStack_a88 = 0;
              local_a80 = 0;
              uStack_a78 = 0;
              local_a70 = 0x3ff0000000000000;
              lVar10 = 0x10;
              pdVar11 = (double *)
                        ((long)local_190.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array + 0x10);
              do {
                dVar38 = pdVar11[-1];
                *(double *)((long)&SStack_af8.m_xpr.m_matrix + lVar10) =
                     ((plain_array<double,_9,_0,_0> *)(pdVar11 + -2))->array[0];
                *(double *)((long)&local_af0 + lVar10) = dVar38;
                *(double *)((long)&local_ae8.m_xpr + lVar10) = *pdVar11;
                pdVar11 = pdVar11 + 3;
                lVar10 = lVar10 + 0x20;
              } while (lVar10 != 0x70);
              local_338.m_lhs.m_lhs.m_lhs.m_lhs.m_rhs.m_xpr = (XprTypeNested)local_438;
              local_338.m_lhs.m_rhs = (RhsNested)local_5e8;
              local_338.m_lhs.m_lhs.m_lhs.m_lhs.m_lhs.m_xpr = &local_288;
              local_338.m_lhs.m_lhs.m_lhs.m_rhs.m_xpr = (XprTypeNested)&local_ae8;
              local_338.m_lhs.m_lhs.m_rhs = (RhsNested)&local_ca8;
              local_338.m_rhs = &local_3b8;
              Eigen::internal::
              call_dense_assignment_loop<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,1>,Eigen::internal::assign_op<double,double>>
                        (&local_308,&local_338,(assign_op<double,_double> *)&local_db8);
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                          ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                            *)__return_storage_ptr__,__position,&local_308);
              }
              else {
                pMVar13 = &local_308;
                iVar14._M_current = __position._M_current;
                for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
                  ((iVar14._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                  ).m_storage.m_data.array[0] =
                       (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                       m_storage.m_data.array[0];
                  pMVar13 = (Matrix<double,_4,_4,_0,_4,_4> *)
                            ((long)pMVar13 + ((ulong)bVar16 * -2 + 1) * 8);
                  iVar14._M_current =
                       (Matrix<double,_4,_4,_0,_4,_4> *)
                       ((long)iVar14._M_current + ((ulong)bVar16 * -2 + 1) * 8);
                }
                (__return_storage_ptr__->
                super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              if (local_db0.
                  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_db0.
                                super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_db0.
                                      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_db0.
                                      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              goto LAB_001ae146;
            }
          }
          __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                        ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                       );
        }
      }
    }
  }
  __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                "Eigen::internal::block_evaluator<const Eigen::Matrix<double, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<double, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
               );
}

Assistant:

std::vector<Eigen::Matrix<floatPrec, 4, 4>> solver1M1P(
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair){

	// check input vectors size
	if(lCPair.size() < 1 && plPair.size() < 2){
		std::cerr << "Solver 1M1P requires at least 1 line and 1 plane correspondence!" << std::endl;
		exit(-1);
	}

	std::vector<Eigen::Matrix<floatPrec,4,4>> out;
	out.clear();

	// parse inputs
	Eigen::Matrix<floatPrec, 4, 1> Pi, Nu;
	Pi = plPair[0].first; Nu = plPair[0].second;
	// get lines in plucker coordinates
	std::vector<Eigen::Matrix<floatPrec,6,1>> lines1 = getPluckerCoord(lCPair[0]);

	// check if line and plane are parallel
	if(abs(Pi.head(3).dot(lines1[0].head(3))) < 1e-6){
		// std::cout << Pi.head(3).transpose() << "   " << lines1[0].head(3).transpose() << std::endl; 
		// std::cout << lCPair[0].first.second.head(3).transpose() << "  " << lCPair[0].first.first.head(3).transpose() << std::endl;
		// std::cerr << "Solver 1M1P: The line and plane cannot be parallel!" << std::endl;
		return out;
		// exit(-1);
	}

	// get the predefined transformation matrices
	vector<Matrix<floatPrec, 4, 4>> predTrans = getPredefinedTransformations1Plane3Line<floatPrec>(Pi, Nu);
	Matrix<floatPrec, 4, 4> TU2 = predTrans.back();
	predTrans.pop_back();
	Matrix<floatPrec, 4, 4> TU1 = predTrans.back();
	predTrans.pop_back();

	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,3,3,3) = TU1.topLeftCorner(3,3);
	TUL1.block(3,0,3,3) = -getSkew<floatPrec>(TU1.topRightCorner(3,1))*TU1.topLeftCorner(3,3);
	TUL2.topLeftCorner(3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,3,3,3) = TU2.topLeftCorner(3,3);
	TUL2.block(3,0,3,3) = -getSkew<floatPrec>(TU2.topRightCorner(3,1))*TU2.topLeftCorner(3,3);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lU1 = TUL1*lines1[0];
	Eigen::Matrix<floatPrec,6,1> lU2 = TUL2*lines1[1];
	Eigen::Matrix<floatPrec,4,1> PiU = TU1.transpose().inverse()*Pi;
	Eigen::Matrix<floatPrec,4,1> NuU = TU2.transpose().inverse()*Nu;
	
	// get direction and moment vectors
	Eigen::Matrix<floatPrec,3,1> dir1 = lU1.head(3), m1 = lU1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = lU2.head(3), m2 = lU2.tail(3);
	Eigen::Matrix<floatPrec,3,1> n1 = PiU.head(3), n2 = NuU.head(3);

	// compute intersection line with plane
	Eigen::Matrix<floatPrec,3,1> p1 = (n1.cross(m1) - PiU(3)*dir1)/(n1.dot(dir1));
	Eigen::Matrix<floatPrec,3,1> p2 = (n2.cross(m2) - NuU(3)*dir2)/(n2.dot(dir2));

	Matrix<floatPrec, 4, 4> Tu1 = Matrix<floatPrec, 4, 4>::Identity();
	Tu1.topRightCorner(3,1) = p1;
	Matrix<floatPrec, 4, 4> Tu2 = Matrix<floatPrec, 4, 4>::Identity();
	Tu2.topRightCorner(3,1) = p2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(p1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(p2);

	// transform features
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*lU1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*lU2;
	Eigen::Matrix<floatPrec,4,1> Piu = Tu1.transpose().inverse()*PiU;
	Eigen::Matrix<floatPrec,4,1> Nuu = Tu2.transpose().inverse()*NuU;

	// align x axis wiht projection of line direction to plane
	// project line direction to plane
	dir1 = lu1.head(3); m1 = lu1.tail(3);
	dir2 = lu2.head(3); m2 = lu2.tail(3);
	n1 = Piu.head(3); n2 = Nuu.head(3);
	// frame A
	Eigen::Matrix<floatPrec,3,1> w = (dir1 - dir1.dot(n1)*n1).normalized();
	floatPrec alpha1 = atan2(w(1),w(0));
	Eigen::Matrix<floatPrec,3,3> V1;
	V1 << cos(alpha1),sin(alpha1),0,-sin(alpha1),cos(alpha1),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV1.topLeftCorner(3,3) = V1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> w2 = (dir2 - dir2.dot(n2)*n2).normalized();
	floatPrec alpha2 = atan2(w2(1),w2(0));
	Eigen::Matrix<floatPrec,3,3> V2;
	V2 << cos(alpha2),sin(alpha2),0,-sin(alpha2),cos(alpha2),0,0,0,1;
	Eigen::Matrix<floatPrec,4,4> TV2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TV2.topLeftCorner(3,3) = V2;

	Eigen::Matrix<floatPrec,4,4> sol = TU2.inverse()*Tu2.inverse()*TV2.inverse()*TV1*Tu1*TU1;
	out.push_back(sol);

	return out;
}